

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

int __thiscall
TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontSym<float>_>::Subst_Forward
          (TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontSym<float>_> *this,
          TPZFMatrix<float> *b)

{
  undefined8 in_RSI;
  TPZFMatrix<float> *in_RDI;
  TPZStackEqnStorage<float> *unaff_retaddr;
  DecomposeType dec;
  DecomposeType dec_00;
  TPZFMatrix<float> *f;
  
  dec_00 = (DecomposeType)((ulong)in_RSI >> 0x20);
  f = in_RDI;
  std::operator<<((ostream *)&std::cout,"Entering Forward Substitution\n");
  std::ostream::flush();
  TPZFrontSym<float>::GetDecomposeType((TPZFrontSym<float> *)in_RDI[0x26d].fPivot.fExtAlloc);
  TPZStackEqnStorage<float>::Forward(unaff_retaddr,f,dec_00);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::Subst_Forward(TPZFMatrix<TVar> *b) const {
	cout << "Entering Forward Substitution\n";
	cout.flush();
	DecomposeType dec = fFront.GetDecomposeType();
//	if(dec != ECholesky) cout << "TPZFrontMatrix::Subst_Forward non matching decomposition\n";
	fStorage.Forward(*b, dec);
	return 1;
}